

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O0

bool __thiscall FTraceInfo::ThingCheck(FTraceInfo *this,intercept_t *in,double dist,DVector3 *hit)

{
  double *pdVar1;
  sector_t *psVar2;
  bool bVar3;
  uint uVar4;
  FTextureID FVar5;
  ETraceStatus EVar6;
  double dVar7;
  double dVar8;
  TVector2<double> local_c0;
  double local_b0;
  double ff_ceiling;
  double local_98;
  double ff_floor;
  TVector3<double> local_78;
  TVector3<double> local_60;
  TVector3<double> local_48;
  DVector3 *local_30;
  DVector3 *hit_local;
  double dist_local;
  intercept_t *in_local;
  FTraceInfo *this_local;
  
  dVar8 = hit->Z;
  local_30 = hit;
  hit_local = (DVector3 *)dist;
  dist_local = (double)in;
  in_local = (intercept_t *)this;
  dVar7 = AActor::Top((in->d).thing);
  if (dVar7 < dVar8) {
    if (0.0 <= (this->Vec).Z) {
      return true;
    }
    dVar8 = AActor::Top(*(AActor **)((long)dist_local + 0x10));
    hit_local = (DVector3 *)((dVar8 - (this->Start).Z) / (this->Vec).Z);
    if (this->MaxDist <= (double)hit_local && (double)hit_local != this->MaxDist) {
      return true;
    }
    *(double *)dist_local = (double)hit_local / this->MaxDist;
    ::operator*(&local_60,&this->Vec,(double)hit_local);
    TVector3<double>::operator+(&local_48,&this->Start,&local_60);
    TVector3<double>::operator=(hit,&local_48);
    dVar8 = hit->X;
    dVar7 = AActor::X(*(AActor **)((long)dist_local + 0x10));
    dVar8 = ABS(dVar8 - dVar7);
    pdVar1 = (double *)(*(long *)((long)dist_local + 0x10) + 0x158);
    if ((*pdVar1 <= dVar8 && dVar8 != *pdVar1) ||
       (dVar8 = hit->Y, dVar7 = AActor::Y(*(AActor **)((long)dist_local + 0x10)),
       dVar8 = ABS(dVar8 - dVar7), pdVar1 = (double *)(*(long *)((long)dist_local + 0x10) + 0x158),
       *pdVar1 <= dVar8 && dVar8 != *pdVar1)) {
      return true;
    }
  }
  else {
    dVar8 = hit->Z;
    dVar7 = AActor::Z(*(AActor **)((long)dist_local + 0x10));
    if (dVar8 < dVar7) {
      if ((this->Vec).Z <= 0.0) {
        return true;
      }
      dVar8 = AActor::Z(*(AActor **)((long)dist_local + 0x10));
      hit_local = (DVector3 *)((dVar8 - (this->Start).Z) / (this->Vec).Z);
      if (this->MaxDist <= (double)hit_local && (double)hit_local != this->MaxDist) {
        return true;
      }
      *(double *)dist_local = (double)hit_local / this->MaxDist;
      ::operator*((TVector3<double> *)&ff_floor,&this->Vec,(double)hit_local);
      TVector3<double>::operator+(&local_78,&this->Start,(TVector3<double> *)&ff_floor);
      TVector3<double>::operator=(hit,&local_78);
      dVar8 = hit->X;
      dVar7 = AActor::X(*(AActor **)((long)dist_local + 0x10));
      dVar8 = ABS(dVar8 - dVar7);
      pdVar1 = (double *)(*(long *)((long)dist_local + 0x10) + 0x158);
      if ((*pdVar1 <= dVar8 && dVar8 != *pdVar1) ||
         (dVar8 = hit->Y, dVar7 = AActor::Y(*(AActor **)((long)dist_local + 0x10)),
         dVar8 = ABS(dVar8 - dVar7), pdVar1 = (double *)(*(long *)((long)dist_local + 0x10) + 0x158)
         , *pdVar1 <= dVar8 && dVar8 != *pdVar1)) {
        return true;
      }
    }
  }
  uVar4 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                    ((TArray<F3DFloor_*,_F3DFloor_*> *)&this->CurSector->e->XFloor);
  if (uVar4 == 0) {
switchD_006ddc6f_default:
    this->Results->HitType = TRACE_HitActor;
    TVector3<double>::operator=(&this->Results->HitPos,hit);
    SetSourcePosition(this);
    this->Results->Distance = (double)hit_local;
    this->Results->Fraction = *(double *)dist_local;
    this->Results->Actor = *(AActor **)((long)dist_local + 0x10);
    if (this->TraceCallback == (_func_ETraceStatus_FTraceResults_ptr_void_ptr *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      EVar6 = (*this->TraceCallback)(this->Results,this->TraceCallbackData);
      if (EVar6 == TRACE_Stop) {
        this_local._7_1_ = false;
      }
      else if (EVar6 == TRACE_Skip) {
        this->Results->HitType = TRACE_HitNone;
        this_local._7_1_ = true;
      }
      else if (EVar6 == TRACE_Abort) {
        this->Results->HitType = TRACE_HitNone;
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
  }
  else {
    psVar2 = this->CurSector;
    TVector2<double>::TVector2((TVector2<double> *)&ff_ceiling,hit);
    local_98 = secplane_t::ZatPoint(&psVar2->floorplane,(DVector2 *)&ff_ceiling);
    psVar2 = this->CurSector;
    TVector2<double>::TVector2(&local_c0,hit);
    local_b0 = secplane_t::ZatPoint(&psVar2->ceilingplane,&local_c0);
    if ((hit->Z <= local_b0) || (bVar3 = sector_t::PortalBlocksMovement(this->CurSector,1), !bVar3))
    {
      if ((local_98 <= hit->Z) ||
         (bVar3 = sector_t::PortalBlocksMovement(this->CurSector,0), !bVar3))
      goto switchD_006ddc6f_default;
      this->Results->HitType = TRACE_HitFloor;
      FVar5 = sector_t::GetTexture(this->CurSector,0);
      (this->Results->HitTexture).texnum = FVar5.texnum;
    }
    else {
      this->Results->HitType = TRACE_HitCeiling;
      FVar5 = sector_t::GetTexture(this->CurSector,1);
      (this->Results->HitTexture).texnum = FVar5.texnum;
    }
    this->Results->Sector = sectors + this->CurSector->sectornum;
    bVar3 = CheckSectorPlane(this,this->CurSector,this->Results->HitType == TRACE_HitFloor);
    if (!bVar3) {
      this->Results->HitType = TRACE_HitNone;
    }
    if (this->TraceCallback == (_func_ETraceStatus_FTraceResults_ptr_void_ptr *)0x0) {
      return false;
    }
    EVar6 = (*this->TraceCallback)(this->Results,this->TraceCallbackData);
    switch(EVar6) {
    case TRACE_Stop:
      this_local._7_1_ = false;
      break;
    case TRACE_Continue:
      this_local._7_1_ = true;
      break;
    case TRACE_Skip:
      this->Results->HitType = TRACE_HitNone;
      this_local._7_1_ = true;
      break;
    case TRACE_Abort:
      this->Results->HitType = TRACE_HitNone;
      this_local._7_1_ = false;
      break;
    default:
      goto switchD_006ddc6f_default;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool FTraceInfo::ThingCheck(intercept_t *in, double dist, DVector3 hit)
{
	if (hit.Z > in->d.thing->Top())
	{
		// trace enters above actor
		if (Vec.Z >= 0) return true;      // Going up: can't hit

		// Does it hit the top of the actor?
		dist = (in->d.thing->Top() - Start.Z) / Vec.Z;

		if (dist > MaxDist) return true;
		in->frac = dist / MaxDist;

		hit = Start + Vec * dist;

		// calculated coordinate is outside the actor's bounding box
		if (fabs(hit.X - in->d.thing->X()) > in->d.thing->radius ||
			fabs(hit.Y - in->d.thing->Y()) > in->d.thing->radius) return true;
	}
	else if (hit.Z < in->d.thing->Z())
	{ // trace enters below actor
		if (Vec.Z <= 0) return true;      // Going down: can't hit

		// Does it hit the bottom of the actor?
		dist = (in->d.thing->Z() - Start.Z) / Vec.Z;
		if (dist > MaxDist) return true;
		in->frac = dist / MaxDist;

		hit = Start + Vec * dist;

		// calculated coordinate is outside the actor's bounding box
		if (fabs(hit.X - in->d.thing->X()) > in->d.thing->radius ||
			fabs(hit.Y - in->d.thing->Y()) > in->d.thing->radius) return true;
	}

	if (CurSector->e->XFloor.ffloors.Size())
	{
		// check for 3D floor hits first.
		double ff_floor = CurSector->floorplane.ZatPoint(hit);
		double ff_ceiling = CurSector->ceilingplane.ZatPoint(hit);

		if (hit.Z > ff_ceiling && CurSector->PortalBlocksMovement(sector_t::ceiling))	// actor is hit above the current ceiling
		{
			Results->HitType = TRACE_HitCeiling;
			Results->HitTexture = CurSector->GetTexture(sector_t::ceiling);
		}
		else if (hit.Z < ff_floor && CurSector->PortalBlocksMovement(sector_t::floor))	// actor is hit below the current floor
		{
			Results->HitType = TRACE_HitFloor;
			Results->HitTexture = CurSector->GetTexture(sector_t::floor);
		}
		else goto cont1;

		// the trace hit a 3D floor before the thing.
		// Calculate an intersection and abort.
		Results->Sector = &sectors[CurSector->sectornum];
		if (!CheckSectorPlane(CurSector, Results->HitType == TRACE_HitFloor))
		{
			Results->HitType = TRACE_HitNone;
		}
		if (TraceCallback != NULL)
		{
			switch (TraceCallback(*Results, TraceCallbackData))
			{
			case TRACE_Continue: return true;
			case TRACE_Stop:	 return false;
			case TRACE_Abort:	 Results->HitType = TRACE_HitNone; return false;
			case TRACE_Skip:	 Results->HitType = TRACE_HitNone; return true;
			}
		}
		else
		{
			return false;
		}
	}
cont1:


	Results->HitType = TRACE_HitActor;
	Results->HitPos = hit;
	SetSourcePosition();
	Results->Distance = dist;
	Results->Fraction = in->frac;
	Results->Actor = in->d.thing;

	if (TraceCallback != NULL)
	{
		switch (TraceCallback(*Results, TraceCallbackData))
		{
		case TRACE_Stop:	return false;
		case TRACE_Abort:	Results->HitType = TRACE_HitNone; return false;
		case TRACE_Skip:	Results->HitType = TRACE_HitNone; return true;
		default:			return true;
		}
	}
	else
	{
		return false;
	}
}